

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O0

void WebPConvertRGBA32ToUV_C(uint16_t *rgb,uint8_t *u,uint8_t *v,int width)

{
  uint r_00;
  int iVar1;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int b;
  int g;
  int r;
  int i;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  undefined4 local_20;
  undefined8 local_8;
  
  local_8 = in_RDI;
  for (local_20 = 0; local_20 < in_ECX; local_20 = local_20 + 1) {
    r_00 = (uint)*(ushort *)(local_8 + 4);
    iVar1 = VP8RGBToU(r_00,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                      in_stack_ffffffffffffffc8);
    *(char *)(in_RSI + local_20) = (char)iVar1;
    iVar1 = VP8RGBToV(r_00,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                      in_stack_ffffffffffffffc8);
    *(char *)(in_RDX + local_20) = (char)iVar1;
    local_8 = local_8 + 8;
  }
  return;
}

Assistant:

void WebPConvertRGBA32ToUV_C(const uint16_t* rgb,
                             uint8_t* u, uint8_t* v, int width) {
  int i;
  for (i = 0; i < width; i += 1, rgb += 4) {
    const int r = rgb[0], g = rgb[1], b = rgb[2];
    u[i] = VP8RGBToU(r, g, b, YUV_HALF << 2);
    v[i] = VP8RGBToV(r, g, b, YUV_HALF << 2);
  }
}